

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket>::
disposeImpl(HeapDisposer<kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket> *this,
           void *pointer)

{
  if (pointer != (void *)0x0) {
    NullableValue<kj::Promise<void>_>::~NullableValue
              ((NullableValue<kj::Promise<void>_> *)((long)pointer + 0x18));
    Own<kj::WebSocket,_std::nullptr_t>::dispose
              ((Own<kj::WebSocket,_std::nullptr_t> *)((long)pointer + 8));
  }
  operator_delete(pointer,0x30);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }